

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_FeatureVectorizer_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00437c48 == '\x01') {
    DAT_00437c48 = '\0';
    (*(code *)*_FeatureVectorizer_InputColumn_default_instance_)();
  }
  if (DAT_00437c80 == '\x01') {
    DAT_00437c80 = 0;
    (*(code *)*_FeatureVectorizer_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FeatureVectorizer_InputColumn_default_instance_.Shutdown();
  _FeatureVectorizer_default_instance_.Shutdown();
}